

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_do(Curl_easy *data,_Bool *done)

{
  uint *puVar1;
  byte bVar2;
  SMTP *pSVar3;
  curl_trc_feat *pcVar4;
  curl_slist *pcVar5;
  _Bool _Var6;
  CURLcode CVar7;
  CURLcode CVar8;
  char *pcVar9;
  char *pcVar10;
  curl_off_t cVar11;
  char *pcVar12;
  ulong uVar13;
  undefined1 connected;
  char **ppcVar14;
  curl_mimepart *part;
  anon_union_280_9_4527acc7_for_proto *pp;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  connectdata *pcVar18;
  bool bVar19;
  char *pcVar20;
  curl_slist **ppcVar21;
  char *local_78;
  char *address;
  connectdata *local_60;
  hostname host;
  
  *done = false;
  pcVar9 = (data->set).str[0x1c];
  if ((pcVar9 != (char *)0x0) &&
     (CVar7 = Curl_urldecode(pcVar9,0,&((data->req).p.file)->freepath,(size_t *)0x0,REJECT_CTRL),
     CVar7 != CURLE_OK)) {
    return CVar7;
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  connected = 0xff;
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pSVar3 = (data->req).p.smtp;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    connected = 0xca;
    Curl_trc_smtp(data,"smtp_perform(), start");
  }
  if (((data->req).field_0xdb & 2) != 0) {
    pSVar3->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  pSVar3->rcpt = (data->set).mail_rcpt;
  pSVar3->rcpt_last_error = 0;
  pSVar3->field_0x28 = pSVar3->field_0x28 & 0xfc | 2;
  pSVar3->eob = 2;
  if (((((data->state).field_0x746 & 2) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) ||
     ((data->set).mail_rcpt == (curl_slist *)0x0)) {
    CVar7 = smtp_perform_command(data);
    if (CVar7 != CURLE_OK) goto LAB_001509b0;
  }
  else {
    pcVar18 = data->conn;
    pcVar9 = (data->set).str[0x36];
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)("<>");
      bVar19 = false;
LAB_00150630:
      CVar7 = CURLE_OUT_OF_MEMORY;
      if (pcVar9 == (char *)0x0) goto LAB_00150690;
      pcVar10 = (data->set).str[0x37];
      if ((pcVar10 == (char *)0x0) || (*(short *)((long)&pcVar18->proto + 0xbc) == 0)) {
        local_78 = (char *)0x0;
LAB_001506a5:
        if ((data->set).mimepost.kind == MIMEKIND_NONE) {
          pcVar10 = (char *)(data->state).infilesize;
          CVar8 = Curl_creader_set_fread(data,(curl_off_t)pcVar10);
          if (CVar8 != CURLE_OK) goto LAB_00150741;
LAB_00150751:
          bVar2 = *(byte *)((long)&pcVar18->proto + 0xd0);
          local_60 = pcVar18;
          if (((bVar2 & 4) == 0) || (pcVar10 = (char *)(data->state).infilesize, (long)pcVar10 < 1))
          {
            pcVar12 = (char *)0x0;
LAB_001507ad:
            if (((bVar2 & 8) != 0) && (!bVar19)) {
              ppcVar21 = &((data->req).p.smtp)->rcpt;
              while ((pcVar5 = *ppcVar21, pcVar5 != (curl_slist *)0x0 && (!bVar19))) {
                _Var6 = Curl_is_ASCII_name(pcVar5->data);
                if (!_Var6) {
                  bVar19 = true;
                }
                ppcVar21 = &pcVar5->next;
              }
            }
            host.rawalloc = (char *)0x0;
            CVar7 = Curl_creader_create((Curl_creader **)&host,data,&cr_eob,CURL_CR_CONTENT_ENCODE);
            if (CVar7 == CURLE_OK) {
              CVar7 = Curl_creader_add(data,(Curl_creader *)host.rawalloc);
            }
            pcVar10 = host.rawalloc;
            pcVar15 = pcVar12;
            if (host.rawalloc == (char *)0x0 || CVar7 == CURLE_OK) {
              if (CVar7 == CURLE_OK) {
                pp = &local_60->proto;
                pcVar10 = " AUTH=";
                pcVar15 = local_78;
                if (local_78 == (char *)0x0) {
                  pcVar10 = "";
                  pcVar15 = "";
                }
                pcVar16 = " SIZE=";
                pcVar17 = pcVar12;
                if (pcVar12 == (char *)0x0) {
                  pcVar16 = "";
                  pcVar17 = "";
                }
                pcVar20 = " SMTPUTF8";
                if (!bVar19) {
                  pcVar20 = "";
                }
                CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MAIL FROM:%s%s%s%s%s%s",pcVar9,pcVar10,
                                      pcVar15,pcVar16,pcVar17,pcVar20);
                connected = SUB81(pp,0);
                goto LAB_00150996;
              }
            }
            else {
              Curl_creader_free(data,(Curl_creader *)host.rawalloc);
            }
          }
          else {
            pcVar12 = curl_maprintf("%ld");
            pcVar15 = (char *)0x0;
            if (pcVar12 != (char *)0x0) {
              bVar2 = *(byte *)((long)&local_60->proto + 0xd0);
              goto LAB_001507ad;
            }
          }
        }
        else {
          part = &(data->set).mimepost;
          puVar1 = &(data->set).mimepost.flags;
          *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
          local_60 = pcVar18;
          curl_mime_headers(part,(data->set).headers,0);
          pcVar10 = (char *)part;
          CVar8 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
          if (CVar8 == CURLE_OK) {
            pcVar10 = Curl_checkheaders(data,"Mime-Version",0xc);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "Mime-Version: 1.0";
              CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
              if (CVar8 != CURLE_OK) goto LAB_00150741;
            }
            CVar8 = Curl_creader_set_mime(data,part);
            pcVar10 = (char *)part;
            if (CVar8 == CURLE_OK) {
              cVar11 = Curl_creader_total_length(data);
              (data->state).infilesize = cVar11;
              pcVar18 = local_60;
              goto LAB_00150751;
            }
          }
LAB_00150741:
          pcVar15 = (char *)0x0;
          CVar7 = CVar8;
        }
        connected = SUB81(pcVar10,0);
        pcVar12 = pcVar15;
      }
      else {
        if (*pcVar10 == '\0') {
          local_78 = (*Curl_cstrdup)("<>");
LAB_0015097e:
          CVar8 = CVar7;
          if (local_78 != (char *)0x0) goto LAB_001506a5;
        }
        else {
          ppcVar14 = &address;
          address = (char *)0x0;
          host.name = (char *)0x0;
          host.dispname = (char *)0x0;
          host.rawalloc = (char *)0x0;
          host.encalloc = (char *)0x0;
          CVar8 = smtp_parse_address(pcVar10,ppcVar14,&host);
          connected = SUB81(ppcVar14,0);
          if (CVar8 == CURLE_OK) {
            if (((!bVar19) && ((*(byte *)((long)&pcVar18->proto + 0xd0) & 8) != 0)) &&
               ((host.encalloc != (char *)0x0 ||
                ((_Var6 = Curl_is_ASCII_name(address), !_Var6 ||
                 (_Var6 = Curl_is_ASCII_name(host.name), !_Var6)))))) {
              bVar19 = true;
            }
            pcVar10 = address;
            if (host.name == (char *)0x0) {
              pcVar12 = address;
              local_78 = curl_maprintf("<%s>");
              connected = SUB81(pcVar12,0);
            }
            else {
              pcVar12 = address;
              local_78 = curl_maprintf("<%s@%s>");
              connected = SUB81(pcVar12,0);
            }
            (*Curl_cfree)(pcVar10);
            goto LAB_0015097e;
          }
        }
        CVar7 = CVar8;
        local_78 = (char *)0x0;
        pcVar12 = (char *)0x0;
      }
    }
    else {
      ppcVar14 = &address;
      address = (char *)0x0;
      host.name = (char *)0x0;
      host.dispname = (char *)0x0;
      host.rawalloc = (char *)0x0;
      host.encalloc = (char *)0x0;
      CVar7 = smtp_parse_address(pcVar9,ppcVar14,&host);
      pcVar10 = address;
      connected = SUB81(ppcVar14,0);
      if (CVar7 == CURLE_OK) {
        if ((*(byte *)((long)&pcVar18->proto + 0xd0) & 8) == 0) {
          bVar19 = false;
        }
        else {
          bVar19 = true;
          if ((host.encalloc == (char *)0x0) && (_Var6 = Curl_is_ASCII_name(address), _Var6)) {
            _Var6 = Curl_is_ASCII_name(host.name);
            bVar19 = !_Var6;
          }
        }
        if (host.name == (char *)0x0) {
          pcVar12 = pcVar10;
          pcVar9 = curl_maprintf("<%s>");
          connected = SUB81(pcVar12,0);
        }
        else {
          pcVar12 = pcVar10;
          pcVar9 = curl_maprintf("<%s@%s>");
          connected = SUB81(pcVar12,0);
        }
        (*Curl_cfree)(pcVar10);
        goto LAB_00150630;
      }
LAB_00150690:
      local_78 = (char *)0x0;
      pcVar9 = (char *)0x0;
      pcVar12 = (char *)0x0;
    }
LAB_00150996:
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(local_78);
    (*Curl_cfree)(pcVar12);
    if (CVar7 != CURLE_OK) {
LAB_001509b0:
      uVar13 = 0;
      goto LAB_001509da;
    }
    smtp_state(data,SMTP_MAIL);
  }
  CVar7 = smtp_multi_statemach(data,done);
  connected = 0;
  _Var6 = Curl_conn_is_connected(data->conn,0);
  uVar13 = (ulong)_Var6;
LAB_001509da:
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    connected = 0xe0;
    Curl_trc_smtp(data,"smtp_perform() -> %d, connected=%d, done=%d",(ulong)CVar7,uVar13,
                  (ulong)*done);
  }
  if ((CVar7 == CURLE_OK) && (*done == true)) {
    smtp_dophase_done(data,(_Bool)connected);
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1)) ||
       ((Curl_trc_feat_smtp.log_level < 1 ||
        (Curl_trc_smtp(data,"smtp_regular_transfer() -> %d, done=%d",(ulong)CVar7,(ulong)*done),
        ((data->set).field_0x8cd & 0x10) != 0)))) &&
      (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
       (0 < Curl_trc_feat_smtp.log_level)))))) {
    Curl_trc_smtp(data,"smtp_do() -> %d, done=%d",(ulong)CVar7,(ulong)*done);
  }
  return CVar7;
}

Assistant:

static CURLcode smtp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(data);
  if(result)
    return result;

  result = smtp_regular_transfer(data, done);
  CURL_TRC_SMTP(data, "smtp_do() -> %d, done=%d", result, *done);
  return result;
}